

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

int Vec_WecCountNonTrivial(Vec_Wec_t *p,int *pnUsed)

{
  Vec_Int_t *pVVar1;
  int i;
  int iVar2;
  
  *pnUsed = 0;
  iVar2 = 0;
  for (i = 0; i < p->nSize; i = i + 1) {
    pVVar1 = Vec_WecEntry(p,i);
    if (1 < pVVar1->nSize) {
      iVar2 = iVar2 + 1;
      *pnUsed = *pnUsed + pVVar1->nSize;
    }
  }
  return iVar2;
}

Assistant:

static inline int Vec_WecCountNonTrivial( Vec_Wec_t * p, int * pnUsed )
{
    Vec_Int_t * vClass;
    int i, nClasses = 0;
    *pnUsed = 0;
    Vec_WecForEachLevel( p, vClass, i )
    {
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        nClasses++;
        (*pnUsed) += Vec_IntSize(vClass);
    }
    return nClasses;
}